

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerLdEnv(Lowerer *this,Instr *instr)

{
  Opnd *pOVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  byte bVar5;
  RegOpnd *in_RAX;
  Instr *pIVar6;
  undefined4 *puVar7;
  IndirOpnd *this_00;
  RegOpnd *local_38;
  Opnd *functionObjOpnd;
  
  pOVar1 = instr->m_src1;
  local_38 = in_RAX;
  pIVar6 = LowererMD::LoadFunctionObjectOpnd(&this->m_lowererMD,instr,(Opnd **)&local_38);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6f54,"(!instr->GetSrc1())","!instr->GetSrc1()");
    if (!bVar3) goto LAB_005c05a8;
    *puVar7 = 0;
  }
  if (pOVar1 == (Opnd *)0x0) {
LAB_005c0347:
    OVar4 = IR::Opnd::GetKind(&local_38->super_Opnd);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_005c05a8;
      *puVar7 = 0;
    }
    this_00 = IR::IndirOpnd::New(local_38,0x30,TyUint64,this->m_func,false);
  }
  else {
    OVar4 = IR::Opnd::GetKind(&local_38->super_Opnd);
    if (OVar4 == OpndKindReg) goto LAB_005c0347;
    OVar4 = IR::Opnd::GetKind(&local_38->super_Opnd);
    if (OVar4 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x6f5d,"(functionObjOpnd->IsAddrOpnd())","functionObjOpnd->IsAddrOpnd()");
      if (!bVar3) goto LAB_005c05a8;
      *puVar7 = 0;
    }
    OVar4 = IR::Opnd::GetKind(&local_38->super_Opnd);
    if (OVar4 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar3) goto LAB_005c05a8;
      *puVar7 = 0;
    }
    this_00 = (IndirOpnd *)
              IR::MemRefOpnd::New(local_38[1].super_Opnd._vptr_Opnd + 6,TyUint64,this->m_func,
                                  AddrOpndKindDynamicFunctionEnvironmentRef);
  }
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005c05a8;
    *puVar7 = 0;
  }
  func = instr->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_005c05a8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  bVar5 = (this_00->super_Opnd).field_0xb;
  if ((bVar5 & 2) != 0) {
    this_00 = (IndirOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,func);
    bVar5 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar5 | 2;
  instr->m_src1 = &this_00->super_Opnd;
  LowererMD::ChangeToAssign(instr);
  return pIVar6;
}

Assistant:

IR::Instr *
Lowerer::LowerLdEnv(IR::Instr * instr)
{
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * functionObjOpnd;
    IR::Instr * instrPrev = this->m_lowererMD.LoadFunctionObjectOpnd(instr, functionObjOpnd);
    Assert(!instr->GetSrc1());
    if (src1 == nullptr || functionObjOpnd->IsRegOpnd())
    {
        IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(functionObjOpnd->AsRegOpnd(),
            Js::ScriptFunction::GetOffsetOfEnvironment(), TyMachPtr, m_func);
        instr->SetSrc1(indirOpnd);
    }
    else
    {
        Assert(functionObjOpnd->IsAddrOpnd());
        IR::AddrOpnd* functionObjAddrOpnd = functionObjOpnd->AsAddrOpnd();
        IR::MemRefOpnd* functionEnvMemRefOpnd = IR::MemRefOpnd::New((void *)((intptr_t)functionObjAddrOpnd->m_address + Js::ScriptFunction::GetOffsetOfEnvironment()),
            TyMachPtr, this->m_func, IR::AddrOpndKindDynamicFunctionEnvironmentRef);
        instr->SetSrc1(functionEnvMemRefOpnd);
    }

    LowererMD::ChangeToAssign(instr);
    return instrPrev;
}